

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

ostream * absl::lts_20250127::operator<<(ostream *os,StatusCode code)

{
  ostream *poVar1;
  StatusCode in_EDX;
  string local_38;
  StatusCode local_14;
  ostream *poStack_10;
  StatusCode code_local;
  ostream *os_local;
  
  local_14 = code;
  poStack_10 = os;
  StatusCodeToString_abi_cxx11_(&local_38,(lts_20250127 *)(ulong)code,in_EDX);
  poVar1 = std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, StatusCode code) {
  return os << StatusCodeToString(code);
}